

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

void NULLCIO::ReadIntFromConsole(int *val)

{
  int iVar1;
  char *error;
  char buf [128];
  char acStack_98 [136];
  
  if (val == (int *)0x0) {
    error = "ERROR: argument should not be a nullptr";
  }
  else {
    if (readFunc != 0) {
      ReadString(acStack_98,0x80);
      iVar1 = __isoc99_sscanf(acStack_98,"%d",val);
      if (iVar1 != 1) {
        nullcThrowError("ERROR: failed to read an int");
      }
      return;
    }
    error = "ERROR: read stream is not avaiable";
  }
  nullcThrowError(error);
  return;
}

Assistant:

void ReadIntFromConsole(int* val)
	{
		if(!val)
		{
			nullcThrowError("ERROR: argument should not be a nullptr");
			return;
		}

		if(!readFunc)
		{
			nullcThrowError("ERROR: read stream is not avaiable");
			return;
		}

		char buf[128];
		ReadString(buf, 128);

		int result = sscanf(buf, "%d", val);

		if(result != 1)
		{
			nullcThrowError("ERROR: failed to read an int");
			return;
		}
	}